

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

void cvRescale(CVodeMem cv_mem)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  sunrealtype *psVar4;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  sunrealtype sVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  psVar4 = cv_mem->cv_cvals;
  *psVar4 = cv_mem->cv_eta;
  uVar1 = cv_mem->cv_q;
  if (0 < (int)uVar1) {
    sVar12 = *psVar4;
    lVar6 = 1;
    do {
      sVar12 = sVar12 * cv_mem->cv_eta;
      psVar4[lVar6] = sVar12;
      lVar6 = lVar6 + 1;
    } while ((ulong)uVar1 + 1 != lVar6);
  }
  N_VScaleVectorArray((ulong)uVar1,psVar4,cv_mem->cv_zn + 1);
  if (cv_mem->cv_quadr != 0) {
    N_VScaleVectorArray(cv_mem->cv_q,cv_mem->cv_cvals,cv_mem->cv_znQ + 1);
  }
  auVar5 = _DAT_00139040;
  iVar2 = cv_mem->cv_sensi;
  if ((iVar2 != 0) || (cv_mem->cv_quadr_sensi != 0)) {
    uVar1 = cv_mem->cv_Ns;
    lVar6 = (long)(int)uVar1;
    if (0 < lVar6) {
      psVar4 = cv_mem->cv_cvals;
      sVar12 = cv_mem->cv_eta;
      lVar7 = (ulong)uVar1 - 1;
      auVar14._8_4_ = (int)lVar7;
      auVar14._0_8_ = lVar7;
      auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar14 = auVar14 ^ _DAT_00139040;
      auVar15 = _DAT_00139030;
      do {
        auVar16 = auVar15 ^ auVar5;
        if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                    auVar14._4_4_ < auVar16._4_4_) & 1)) {
          *(sunrealtype *)((long)psVar4 + lVar7) = sVar12;
        }
        if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
            auVar16._12_4_ <= auVar14._12_4_) {
          *(sunrealtype *)((long)psVar4 + lVar7 + 8) = sVar12;
        }
        lVar10 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uVar1 + 1 >> 1) << 4 != lVar7);
    }
    uVar3 = cv_mem->cv_q;
    if ((int)uVar3 < 1) {
      if (iVar2 == 0) goto LAB_0011f84b;
    }
    else {
      lVar7 = lVar6 * 8;
      lVar8 = 1;
      lVar9 = 0;
      lVar10 = lVar7;
      do {
        if (0 < (int)uVar1) {
          psVar4 = cv_mem->cv_cvals;
          uVar11 = 0;
          do {
            *(double *)((long)psVar4 + uVar11 * 8 + lVar10) =
                 cv_mem->cv_eta * *(double *)((long)psVar4 + uVar11 * 8 + lVar9);
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + lVar7;
        lVar9 = lVar9 + lVar7;
      } while (lVar8 != (ulong)uVar3 + 1);
      if (iVar2 == 0) goto LAB_0011f84b;
      if (0 < (int)uVar3) {
        lVar7 = 1;
        lVar10 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar11 * 8 + lVar10) =
                   cv_mem->cv_znS[lVar7][uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
          }
          lVar7 = lVar7 + 1;
          lVar10 = lVar10 + lVar6 * 8;
        } while (lVar7 != (ulong)uVar3 + 1);
      }
    }
    N_VScaleVectorArray(uVar1 * uVar3,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
  }
LAB_0011f84b:
  if (cv_mem->cv_quadr_sensi != 0) {
    uVar1 = cv_mem->cv_q;
    uVar3 = cv_mem->cv_Ns;
    if (0 < (int)uVar1) {
      lVar6 = 1;
      lVar7 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar11 = 0;
          do {
            *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar11 * 8 + lVar7) =
                 cv_mem->cv_znQS[lVar6][uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar3 != uVar11);
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + (long)(int)uVar3 * 8;
      } while (lVar6 != (ulong)uVar1 + 1);
    }
    N_VScaleVectorArray(uVar1 * uVar3,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
  }
  dVar13 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar13;
  cv_mem->cv_next_h = dVar13;
  cv_mem->cv_hscale = dVar13;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;
  int is;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  if (cv_mem->cv_quadr)
  {
    (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                              cv_mem->cv_znQ + 1, cv_mem->cv_znQ + 1);
  }

  /* compute sensi scaling factors */
  if (cv_mem->cv_sensi || cv_mem->cv_quadr_sensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_eta;
    }
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] =
          cv_mem->cv_eta * cv_mem->cv_cvals[(j - 1) * cv_mem->cv_Ns + is];
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znQS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}